

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedClasses.cpp
# Opt level: O0

void __thiscall chatra::ContainerBase::extend(ContainerBase *this,size_t required)

{
  Object *this_00;
  size_t sVar1;
  unsigned_long *puVar2;
  Reference local_70;
  Reference local_68;
  Reference local_60;
  Reference local_58;
  ulong local_50;
  size_t i;
  Object *local_40;
  Object *o0;
  Object *local_30;
  ContainerBody *o1;
  Reference local_20;
  size_t local_18;
  size_t required_local;
  ContainerBase *this_local;
  
  if (this->capacity < required) {
    local_18 = required;
    required_local = (size_t)this;
    if (this->capacity == 0) {
      local_20 = Object::ref((Object *)this,0);
      this_00 = Reference::deref<chatra::Object>(&local_20);
      sVar1 = Object::size(this_00);
      this->capacity = sVar1;
      if (local_18 <= this->capacity) {
        return;
      }
    }
    o1 = (ContainerBody *)(this->capacity * 3 >> 1);
    puVar2 = std::max<unsigned_long>(&local_18,(unsigned_long *)&o1);
    this->capacity = *puVar2;
    o0 = (Object *)Object::ref((Object *)this,1);
    local_30 = &Reference::allocate<chatra::ContainerBody,unsigned_long&>
                          ((Reference *)&o0,&this->capacity)->super_Object;
    i = (size_t)Object::ref((Object *)this,0);
    local_40 = Reference::deref<chatra::Object>((Reference *)&i);
    for (local_50 = 0; local_50 < this->length; local_50 = local_50 + 1) {
      local_58 = Object::ref(local_30,local_50);
      local_60 = Object::ref(local_40,local_50);
      Reference::set(&local_58,&local_60);
    }
    local_68 = Object::ref((Object *)this,0);
    local_70 = Object::ref((Object *)this,1);
    Reference::set(&local_68,&local_70);
  }
  return;
}

Assistant:

void ContainerBase::extend(size_t required) {
	if (required <= capacity)
		return;

	if (capacity == 0) {
		capacity = ref(0).deref().size();
		if (required <= capacity)
			return;
	}

	capacity = std::max(required, capacity * 3 / 2);
	auto& o1 = ref(1).allocate<ContainerBody>(capacity);
	auto& o0 = ref(0).deref();
	for (size_t i = 0; i < length; i++)
		o1.ref(i).set(o0.ref(i));
	ref(0).set(ref(1));
}